

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNA::RhythmMix(OPNA *this,Sample *buffer,uint count)

{
  int iVar1;
  uint uVar2;
  Rhythm *pRVar3;
  bool bVar4;
  Sample *pSStack_50;
  int sample;
  Sample *dest;
  int maskr;
  int maskl;
  int vol;
  int db;
  Rhythm *r;
  int i;
  Sample *limit;
  uint count_local;
  Sample *buffer_local;
  OPNA *this_local;
  
  if (((this->rhythmtvol < 0x80) && (this->rhythm[0].sample != (int16 *)0x0)) &&
     ((this->rhythmkey & 0x3f) != 0)) {
    for (r._4_4_ = 0; r._4_4_ < 6; r._4_4_ = r._4_4_ + 1) {
      pRVar3 = this->rhythm + r._4_4_;
      if (((uint)this->rhythmkey & 1 << ((byte)r._4_4_ & 0x1f)) != 0) {
        iVar1 = Limit((int)this->rhythmtl + this->rhythmtvol + (int)pRVar3->level + pRVar3->volume,
                      0x7f,-0x1f);
        iVar1 = (&OPNABase::tltable)[iVar1 + 0x20];
        dest._4_4_ = -((int)(uint)pRVar3->pan >> 1 & 1U);
        dest._0_4_ = -(pRVar3->pan & 1);
        pSStack_50 = buffer;
        if (((this->super_OPNABase).rhythmmask_ & 1 << ((byte)r._4_4_ & 0x1f)) != 0) {
          dest._0_4_ = 0;
          dest._4_4_ = 0;
        }
        while( true ) {
          bVar4 = false;
          if (pSStack_50 < buffer + (count << 1)) {
            bVar4 = pRVar3->pos < pRVar3->size;
          }
          if (!bVar4) break;
          uVar2 = (int)pRVar3->sample[pRVar3->pos >> 10] * (iVar1 >> 4) >> 0xc;
          pRVar3->pos = pRVar3->step + pRVar3->pos;
          StoreSample(pSStack_50,uVar2 & dest._4_4_);
          StoreSample(pSStack_50 + 1,uVar2 & (uint)dest);
          pSStack_50 = pSStack_50 + 2;
        }
      }
    }
  }
  return;
}

Assistant:

void OPNA::RhythmMix(Sample* buffer, uint count)
{
	if (rhythmtvol < 128 && rhythm[0].sample && (rhythmkey & 0x3f))
	{
		Sample* limit = buffer + count * 2;
		for (int i=0; i<6; i++)
		{
			Rhythm& r = rhythm[i];
			if ((rhythmkey & (1 << i)) /*&& r.level < 128*/) // libOPNMIDI: Useless condition, signed int 8t has 127 max
			{
				int db = Limit(rhythmtl+rhythmtvol+r.level+r.volume, 127, -31);
				int vol = tltable[FM_TLPOS+(db << (FM_TLBITS-7))] >> 4;
				int maskl = -((r.pan >> 1) & 1);
				int maskr = -(r.pan & 1);

				if (rhythmmask_ & (1 << i))
				{
					maskl = maskr = 0;
				}

				for (Sample* dest = buffer; dest<limit && r.pos < r.size; dest+=2)
				{
					int sample = (r.sample[r.pos / 1024] * vol) >> 12;
					r.pos += r.step;
					StoreSample(dest[0], sample & maskl);
					StoreSample(dest[1], sample & maskr);
				}
			}
		}
	}
}